

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.cpp
# Opt level: O0

ExprPtr __thiscall mathiu::impl::coefficientList(impl *this,ExprPtr *u,ExprPtr *x)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExprPtr EVar1;
  shared_ptr<const_mathiu::impl::Expr> local_58;
  int local_44;
  undefined1 local_40 [4];
  int i;
  List result;
  Integer deg;
  ExprPtr *x_local;
  ExprPtr *u_local;
  
  result.super_ExprPtrList.
  super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = degree(u,x);
  List::List((List *)local_40);
  for (local_44 = 0;
      local_44 <=
      result.super_ExprPtrList.
      super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_44 = local_44 + 1) {
    coefficient((impl *)&local_58,u,x,local_44);
    std::
    vector<std::shared_ptr<mathiu::impl::Expr_const>,std::allocator<std::shared_ptr<mathiu::impl::Expr_const>>>
    ::emplace_back<std::shared_ptr<mathiu::impl::Expr_const>>
              ((vector<std::shared_ptr<mathiu::impl::Expr_const>,std::allocator<std::shared_ptr<mathiu::impl::Expr_const>>>
                *)local_40,&local_58);
    std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_58);
  }
  makeSharedExprPtr<mathiu::impl::List>((List *)this);
  List::~List((List *)local_40);
  EVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ExprPtr)EVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr coefficientList(ExprPtr const &u, ExprPtr const &x)
    {
        auto const deg = degree(u, x);
        List result;
        for (auto i = 0; i <= deg; ++i)
        {
            result.emplace_back(coefficient(u, x, i));
        }
        return makeSharedExprPtr(std::move(result));
    }